

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fretFlow.c
# Opt level: O2

int dfsfast_e(Abc_Obj_t *pObj,Abc_Obj_t *pPred)

{
  ushort uVar1;
  uint uVar2;
  int *piVar3;
  MinRegMan_t *pMVar4;
  int iVar5;
  int iVar6;
  ulong uVar7;
  void *pvVar8;
  Abc_Obj_t *pAVar9;
  Flow_Data_t *pFVar10;
  ulong uVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  ulong uVar16;
  long lVar17;
  
  if (pManMR->fSinkDistTerminate != 0) {
    return 0;
  }
  uVar12 = *(uint *)(pManMR->pDataArray + (uint)pObj->Id);
  if (((pManMR->constraintMask & uVar12 & 0x90) == 0) && ((*(uint *)&pObj->field_0x14 & 0xf) != 2))
  {
    *(ushort *)(pManMR->pDataArray + (uint)pObj->Id) = (ushort)uVar12 | 1;
    if (pManMR->fIsForward == 0) {
      for (lVar17 = 0; lVar17 < (pObj->vFanins).nSize; lVar17 = lVar17 + 1) {
        pAVar9 = (Abc_Obj_t *)pObj->pNtk->vObjs->pArray[(pObj->vFanins).pArray[lVar17]];
        pFVar10 = pManMR->pDataArray;
        uVar12 = pAVar9->Id;
        if ((((undefined1  [24])((undefined1  [24])pFVar10[uVar12] & (undefined1  [24])0x2) ==
              (undefined1  [24])0x0) &&
            ((uint)*(ushort *)&pFVar10[(uint)pObj->Id].field_0x10 ==
             *(ushort *)&pFVar10[uVar12].field_0x12 + 1)) &&
           (iVar5 = dfsfast_r(pAVar9,pPred), iVar5 != 0)) goto LAB_00410111;
      }
    }
    else {
      for (lVar17 = 0; lVar17 < (pObj->vFanouts).nSize; lVar17 = lVar17 + 1) {
        pAVar9 = (Abc_Obj_t *)pObj->pNtk->vObjs->pArray[(pObj->vFanouts).pArray[lVar17]];
        pFVar10 = pManMR->pDataArray;
        uVar12 = pAVar9->Id;
        if ((((undefined1  [24])((undefined1  [24])pFVar10[uVar12] & (undefined1  [24])0x2) ==
              (undefined1  [24])0x0) &&
            ((uint)*(ushort *)&pFVar10[(uint)pObj->Id].field_0x10 ==
             *(ushort *)&pFVar10[uVar12].field_0x12 + 1)) &&
           (iVar5 = dfsfast_r(pAVar9,pPred), iVar5 != 0)) goto LAB_00410111;
      }
    }
    if ((*(uint *)&pObj->field_0x14 & 0xf) == 8) {
      uVar11 = (ulong)(uint)pObj->Id;
    }
    else {
      if (pManMR->fIsForward == 0) {
        for (lVar17 = 0; lVar17 < (pObj->vFanouts).nSize; lVar17 = lVar17 + 1) {
          pAVar9 = (Abc_Obj_t *)pObj->pNtk->vObjs->pArray[(pObj->vFanouts).pArray[lVar17]];
          pFVar10 = pManMR->pDataArray;
          uVar12 = pAVar9->Id;
          if ((((undefined1  [24])((undefined1  [24])pFVar10[uVar12] & (undefined1  [24])0x1) ==
                (undefined1  [24])0x0) &&
              ((uint)*(ushort *)&pFVar10[(uint)pObj->Id].field_0x10 ==
               *(ushort *)&pFVar10[uVar12].field_0x10 + 1)) &&
             (iVar5 = dfsfast_e(pAVar9,pPred), iVar5 != 0)) goto LAB_00410111;
        }
        if (pManMR->maxDelay != 0) {
          iVar5 = 0;
          while( true ) {
            if (pManMR->vTimeEdges[(uint)pObj->Id].nSize <= iVar5) break;
            pAVar9 = (Abc_Obj_t *)Vec_PtrEntry(pManMR->vTimeEdges + (uint)pObj->Id,iVar5);
            pFVar10 = pManMR->pDataArray;
            if ((((undefined1  [24])
                  ((undefined1  [24])pFVar10[(uint)pAVar9->Id] & (undefined1  [24])0x1) ==
                  (undefined1  [24])0x0) &&
                ((uint)*(ushort *)&pFVar10[(uint)pObj->Id].field_0x10 ==
                 *(ushort *)&pFVar10[(uint)pAVar9->Id].field_0x10 + 1)) &&
               (iVar6 = dfsfast_e(pAVar9,pPred), iVar6 != 0)) goto LAB_00410111;
            iVar5 = iVar5 + 1;
          }
        }
      }
      pFVar10 = pManMR->pDataArray;
      uVar11 = (ulong)(uint)pObj->Id;
      if (((undefined1  [24])((undefined1  [24])pFVar10[uVar11] & (undefined1  [24])0x6) ==
           (undefined1  [24])0x4) &&
         ((*(uint *)&pFVar10[uVar11].field_0x10 & 0xffff) ==
          (*(uint *)&pFVar10[uVar11].field_0x10 >> 0x10) + 1)) {
        iVar5 = dfsfast_r(pObj,pFVar10[uVar11].field_1.pred);
        uVar11 = (ulong)(uint)pObj->Id;
        if (iVar5 != 0) {
          *(ushort *)(pManMR->pDataArray + uVar11) =
               *(ushort *)(pManMR->pDataArray + uVar11) & 0xfffb;
          FSETPRED(pObj,(Abc_Obj_t *)0x0);
LAB_00410111:
          *(ushort *)(pManMR->pDataArray + (uint)pObj->Id) =
               *(ushort *)(pManMR->pDataArray + (uint)pObj->Id) & 0xfffe;
          goto LAB_0040ffb8;
        }
      }
    }
    *(ushort *)(pManMR->pDataArray + uVar11) = *(ushort *)(pManMR->pDataArray + uVar11) & 0xfffe;
    pFVar10 = pManMR->pDataArray;
    uVar11 = (ulong)(uint)pObj->Id;
    uVar2 = *(uint *)&pFVar10[uVar11].field_0x10;
    if (pManMR->fIsForward == 0) {
      uVar12 = (pObj->vFanins).nSize;
      uVar16 = 0;
      uVar7 = (ulong)uVar12;
      if ((int)uVar12 < 1) {
        uVar7 = uVar16;
      }
      uVar15 = 30000;
      for (; uVar7 != uVar16; uVar16 = uVar16 + 1) {
        uVar12 = *(uint *)&pFVar10[*(uint *)((long)pObj->pNtk->vObjs->pArray
                                                   [(pObj->vFanins).pArray[uVar16]] + 0x10)].
                           field_0x10 >> 0x10;
        if (uVar15 < uVar12) {
          uVar12 = uVar15;
        }
        if (0xffff < *(uint *)&pFVar10[*(uint *)((long)pObj->pNtk->vObjs->pArray
                                                       [(pObj->vFanins).pArray[uVar16]] + 0x10)].
                               field_0x10) {
          uVar15 = uVar12;
        }
      }
    }
    else {
      uVar12 = (pObj->vFanouts).nSize;
      uVar16 = 0;
      uVar7 = (ulong)uVar12;
      if ((int)uVar12 < 1) {
        uVar7 = uVar16;
      }
      uVar15 = 30000;
      for (; uVar7 != uVar16; uVar16 = uVar16 + 1) {
        uVar12 = *(uint *)&pFVar10[*(uint *)((long)pObj->pNtk->vObjs->pArray
                                                   [(pObj->vFanouts).pArray[uVar16]] + 0x10)].
                           field_0x10 >> 0x10;
        if (uVar15 < uVar12) {
          uVar12 = uVar15;
        }
        if (0xffff < *(uint *)&pFVar10[*(uint *)((long)pObj->pNtk->vObjs->pArray
                                                       [(pObj->vFanouts).pArray[uVar16]] + 0x10)].
                               field_0x10) {
          uVar15 = uVar12;
        }
      }
    }
    uVar13 = uVar2;
    if ((*(uint *)&pObj->field_0x14 & 0xf) != 8) {
      uVar12 = uVar2 >> 0x10;
      if (uVar15 < uVar2 >> 0x10) {
        uVar12 = uVar15;
      }
      if (uVar2 < 0x10000) {
        uVar12 = uVar15;
      }
      if ((undefined1  [24])((undefined1  [24])pFVar10[uVar11] & (undefined1  [24])0x4) ==
          (undefined1  [24])0x0) {
        uVar12 = uVar15;
      }
      uVar15 = uVar12;
      if (pManMR->fIsForward == 0) {
        uVar12 = (pObj->vFanouts).nSize;
        uVar16 = 0;
        uVar7 = (ulong)uVar12;
        if ((int)uVar12 < 1) {
          uVar7 = uVar16;
        }
        for (; uVar7 != uVar16; uVar16 = uVar16 + 1) {
          uVar1 = *(ushort *)
                   &pFVar10[*(uint *)((long)pObj->pNtk->vObjs->pArray
                                            [(pObj->vFanouts).pArray[uVar16]] + 0x10)].field_0x10;
          uVar12 = (uint)uVar1;
          if (uVar15 < uVar1) {
            uVar12 = uVar15;
          }
          if (uVar1 != 0) {
            uVar15 = uVar12;
          }
        }
        if (pManMR->maxDelay != 0) {
          for (iVar5 = 0; iVar5 < pManMR->vTimeEdges[uVar11].nSize; iVar5 = iVar5 + 1) {
            pvVar8 = Vec_PtrEntry(pManMR->vTimeEdges + uVar11,iVar5);
            pFVar10 = pManMR->pDataArray;
            uVar1 = *(ushort *)&pFVar10[*(uint *)((long)pvVar8 + 0x10)].field_0x10;
            uVar12 = (uint)uVar1;
            if (uVar15 < uVar1) {
              uVar12 = uVar15;
            }
            if (uVar1 != 0) {
              uVar15 = uVar12;
            }
            uVar11 = (ulong)(uint)pObj->Id;
          }
          uVar13 = *(uint *)&pFVar10[uVar11].field_0x10;
        }
      }
    }
    uVar12 = 0;
    uVar14 = uVar15 + 1;
    if (0x752e < uVar15) {
      uVar14 = uVar12;
    }
    *(uint *)&pFVar10[uVar11].field_0x10 = uVar13 & 0xffff0000 | uVar14 & 0xffff;
    pMVar4 = pManMR;
    if (pManMR->vSinkDistHist->nSize <= (int)uVar14) {
      __assert_fail("min_dist < Vec_IntSize(pManMR->vSinkDistHist)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/fret/fretFlow.c"
                    ,0x1c9,"void dfsfast_e_retreat(Abc_Obj_t *)");
    }
    piVar3 = pManMR->vSinkDistHist->pArray;
    piVar3[uVar2 & 0xffff] = piVar3[uVar2 & 0xffff] + -1;
    piVar3[uVar14] = piVar3[uVar14] + 1;
    if (piVar3[uVar2 & 0xffff] == 0) {
      pMVar4->fSinkDistTerminate = 1;
    }
  }
  else {
    if (pPred == (Abc_Obj_t *)0x0) {
      __assert_fail("pPred",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/fret/fretFlow.c"
                    ,0xdb,"int dfsfast_e(Abc_Obj_t *, Abc_Obj_t *)");
    }
    if (pManMR->fIsForward != 0) {
      __assert_fail("!pManMR->fIsForward",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/fret/fretFlow.c"
                    ,0xdc,"int dfsfast_e(Abc_Obj_t *, Abc_Obj_t *)");
    }
LAB_0040ffb8:
    uVar12 = 1;
  }
  return uVar12;
}

Assistant:

int dfsfast_e( Abc_Obj_t *pObj, Abc_Obj_t *pPred ) {
  int i;
  Abc_Obj_t *pNext;
  
  if (pManMR->fSinkDistTerminate) return 0;

  // have we reached the sink?
  if(FTEST(pObj, BLOCK_OR_CONS) & pManMR->constraintMask ||
     Abc_ObjIsPi(pObj)) {
    assert(pPred);
    assert(!pManMR->fIsForward);
    return 1;
  }

  FSET(pObj, VISITED_E);

#ifdef DEBUG_VISITED
  printf("(%de=%d) ", Abc_ObjId(pObj), FDATA(pObj)->e_dist);
#endif  

  // 1. structural edges
  if (pManMR->fIsForward)
    Abc_ObjForEachFanout( pObj, pNext, i ) {
      if (!FTEST(pNext, VISITED_R) &&
          FDIST(pObj, e, pNext, r) &&
          dfsfast_r(pNext, pPred)) {
#ifdef DEBUG_PRINT_FLOWS
        printf("o");
#endif
        goto found;
      }
    }
  else
    Abc_ObjForEachFanin( pObj, pNext, i ) {
      if (!FTEST(pNext, VISITED_R) &&
          FDIST(pObj, e, pNext, r) &&
          dfsfast_r(pNext, pPred)) {
#ifdef DEBUG_PRINT_FLOWS
        printf("o");
#endif
        goto found;
      }
    }  
  
  if (Abc_ObjIsLatch(pObj))
    goto not_found;

  // 2. reverse edges (backward retiming only)
  if (!pManMR->fIsForward) { 
    Abc_ObjForEachFanout( pObj, pNext, i ) {
      if (!FTEST(pNext, VISITED_E) &&
          FDIST(pObj, e, pNext, e) &&
          dfsfast_e(pNext, pPred)) {
#ifdef DEBUG_PRINT_FLOWS
        printf("i");
#endif
        goto found;
      }
    }

  // 3. timing edges (backward retiming only)
#if !defined(IGNORE_TIMING)
    if (pManMR->maxDelay) 
      Vec_PtrForEachEntry(Abc_Obj_t *, FTIMEEDGES(pObj), pNext, i) {
        if (!FTEST(pNext, VISITED_E) &&
            FDIST(pObj, e, pNext, e) &&
            dfsfast_e(pNext, pPred)) {
#ifdef DEBUG_PRINT_FLOWS
          printf("o");
#endif
          goto found;
        }
      }
#endif
  }
  
  // unwind
  if (FTEST(pObj, FLOW) && 
      !FTEST(pObj, VISITED_R) &&
      FDIST(pObj, e, pObj, r) &&
      dfsfast_r(pObj, FGETPRED(pObj))) {

    FUNSET(pObj, FLOW);
    FSETPRED(pObj, NULL);
#ifdef DEBUG_PRINT_FLOWS
    printf("u");
#endif
    goto found;
  }
  
 not_found:
  FUNSET(pObj, VISITED_E);
  dfsfast_e_retreat(pObj);
  return 0;
  
 found:
#ifdef DEBUG_PRINT_FLOWS
  printf("%d ", Abc_ObjId(pObj));
#endif 
  FUNSET(pObj, VISITED_E);
  return 1;
}